

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlXPathParserContextPtr xmlXPathNewParserContext(xmlChar *str,xmlXPathContextPtr ctxt)

{
  xmlXPathCompExprPtr pxVar1;
  xmlXPathParserContextPtr ret;
  xmlXPathContextPtr ctxt_local;
  xmlChar *str_local;
  
  str_local = (xmlChar *)(*xmlMalloc)(0x58);
  if (str_local == (xmlChar *)0x0) {
    xmlXPathErrMemory(ctxt);
    str_local = (xmlChar *)0x0;
  }
  else {
    memset(str_local,0,0x58);
    *(xmlChar **)(str_local + 8) = str;
    *(xmlChar **)str_local = str;
    *(xmlXPathContextPtr *)(str_local + 0x18) = ctxt;
    pxVar1 = xmlXPathNewCompExpr();
    *(xmlXPathCompExprPtr *)(str_local + 0x38) = pxVar1;
    if (*(long *)(str_local + 0x38) == 0) {
      xmlXPathErrMemory(ctxt);
      (*xmlFree)(*(void **)(str_local + 0x30));
      (*xmlFree)(str_local);
      str_local = (xmlChar *)0x0;
    }
    else if ((ctxt != (xmlXPathContextPtr)0x0) && (ctxt->dict != (xmlDictPtr)0x0)) {
      *(xmlDictPtr *)(*(long *)(str_local + 0x38) + 0x20) = ctxt->dict;
      xmlDictReference(*(xmlDictPtr *)(*(long *)(str_local + 0x38) + 0x20));
    }
  }
  return (xmlXPathParserContextPtr)str_local;
}

Assistant:

xmlXPathParserContextPtr
xmlXPathNewParserContext(const xmlChar *str, xmlXPathContextPtr ctxt) {
    xmlXPathParserContextPtr ret;

    ret = (xmlXPathParserContextPtr) xmlMalloc(sizeof(xmlXPathParserContext));
    if (ret == NULL) {
        xmlXPathErrMemory(ctxt);
	return(NULL);
    }
    memset(ret, 0 , sizeof(xmlXPathParserContext));
    ret->cur = ret->base = str;
    ret->context = ctxt;

    ret->comp = xmlXPathNewCompExpr();
    if (ret->comp == NULL) {
        xmlXPathErrMemory(ctxt);
	xmlFree(ret->valueTab);
	xmlFree(ret);
	return(NULL);
    }
    if ((ctxt != NULL) && (ctxt->dict != NULL)) {
        ret->comp->dict = ctxt->dict;
	xmlDictReference(ret->comp->dict);
    }

    return(ret);
}